

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::mergeErrorCheck
          (TIntermediate *this,TInfoSink *infoSink,TIntermSymbol *symbol,TIntermSymbol *unitSymbol)

{
  byte bVar1;
  EShLanguage language;
  TTypeParameters *this_00;
  TTypeParameters *rhs;
  undefined8 uVar2;
  TString name;
  TString name_00;
  TString name_01;
  TString name_02;
  TString name_03;
  TString name_04;
  TString name_05;
  TString name_06;
  TString name_07;
  TString name_08;
  TString name_09;
  TString structName;
  TString structName_00;
  TString structName_01;
  TString structName_02;
  TString structName_03;
  TString structName_04;
  TString structName_05;
  TString structName_06;
  TString structName_07;
  TString structName_08;
  TString structName_09;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  long *plVar9;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar10;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined8 extraout_RAX_00;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  long lVar11;
  undefined4 extraout_var_44;
  char *pcVar12;
  undefined4 extraout_var_45;
  TString *pTVar13;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined8 extraout_RAX_04;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined8 extraout_RAX_05;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined8 extraout_RAX_06;
  undefined4 extraout_var_72;
  undefined4 extraout_var_73;
  undefined4 extraout_var_74;
  undefined4 extraout_var_75;
  undefined4 extraout_var_76;
  undefined4 extraout_var_77;
  undefined4 extraout_var_78;
  undefined4 extraout_var_79;
  undefined4 extraout_var_80;
  undefined4 extraout_var_81;
  undefined4 extraout_var_82;
  undefined4 extraout_var_83;
  undefined4 extraout_var_84;
  undefined4 extraout_var_85;
  undefined8 extraout_RAX_07;
  undefined4 extraout_var_86;
  undefined4 extraout_var_87;
  undefined4 extraout_var_88;
  undefined4 extraout_var_89;
  undefined4 extraout_var_90;
  undefined4 extraout_var_91;
  undefined4 extraout_var_92;
  undefined4 extraout_var_93;
  undefined4 extraout_var_94;
  undefined4 extraout_var_95;
  undefined4 extraout_var_96;
  undefined4 extraout_var_97;
  undefined4 extraout_var_98;
  undefined4 extraout_var_99;
  undefined4 extraout_var_x00100;
  undefined4 extraout_var_x00101;
  undefined4 extraout_var_x00102;
  undefined4 extraout_var_x00103;
  undefined4 extraout_var_x00104;
  undefined4 extraout_var_x00105;
  undefined4 extraout_var_x00106;
  undefined4 extraout_var_x00107;
  undefined4 extraout_var_x00108;
  undefined4 extraout_var_x00109;
  undefined4 extraout_var_x00110;
  undefined4 extraout_var_x00111;
  undefined4 extraout_var_x00112;
  undefined4 extraout_var_x00113;
  undefined4 extraout_var_x00114;
  undefined4 extraout_var_x00115;
  undefined4 extraout_var_x00116;
  undefined4 extraout_var_x00117;
  undefined4 extraout_var_x00118;
  undefined4 extraout_var_x00119;
  undefined4 extraout_var_x00120;
  undefined4 extraout_var_x00121;
  undefined4 extraout_var_x00122;
  undefined4 extraout_var_x00123;
  undefined4 extraout_var_x00124;
  undefined4 extraout_var_x00125;
  undefined4 extraout_var_x00126;
  undefined4 extraout_var_x00127;
  undefined4 extraout_var_x00128;
  undefined4 extraout_var_x00129;
  undefined4 extraout_var_x00130;
  undefined4 extraout_var_x00131;
  undefined4 extraout_var_x00132;
  undefined4 extraout_var_x00133;
  undefined4 extraout_var_x00134;
  undefined4 extraout_var_x00135;
  undefined4 extraout_var_x00136;
  undefined4 extraout_var_x00137;
  undefined4 extraout_var_x00138;
  undefined4 extraout_var_x00139;
  undefined4 extraout_var_x00140;
  undefined4 extraout_var_x00141;
  undefined4 extraout_var_x00142;
  undefined4 extraout_var_x00143;
  undefined4 extraout_var_x00144;
  undefined4 extraout_var_x00145;
  undefined4 extraout_var_x00146;
  TType *pTVar14;
  undefined8 extraout_RAX_08;
  undefined4 extraout_var_x00148;
  undefined4 extraout_var_x00149;
  undefined4 extraout_var_x00150;
  undefined4 extraout_var_x00151;
  undefined4 extraout_var_x00152;
  undefined4 extraout_var_x00153;
  ulong uVar15;
  int iVar16;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar17;
  TIntermSymbol *pTVar18;
  EShLanguage unitStage;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar19;
  char *__end_2;
  long lVar20;
  uint uVar21;
  undefined4 uVar22;
  char *__end;
  undefined8 uVar23;
  uint uVar24;
  char cVar25;
  bool bVar26;
  undefined4 in_stack_fffffffffffffb88;
  EShLanguage EVar27;
  TIntermSymbol *pTVar28;
  undefined4 uStack_458;
  uint local_450;
  undefined4 uStack_44c;
  undefined4 local_448;
  uint local_444;
  int rpidx;
  int lpidx;
  TType *local_438;
  long local_430;
  TInfoSink *local_428;
  TString errmsg;
  pool_allocator<char> local_3f8;
  TPoolAllocator *local_3f0;
  undefined1 *local_3e8;
  undefined1 local_3d8 [16];
  TPoolAllocator *local_3c8;
  undefined1 *local_3c0;
  undefined1 local_3b0 [16];
  TPoolAllocator *local_3a0;
  undefined1 *local_398;
  undefined1 local_388 [16];
  TPoolAllocator *local_378;
  undefined1 *local_370;
  undefined1 local_360 [16];
  TPoolAllocator *local_350;
  undefined1 *local_348;
  undefined1 local_338 [16];
  TPoolAllocator *local_328;
  undefined1 *local_320;
  undefined1 local_310 [16];
  TPoolAllocator *local_300;
  undefined1 *local_2f8;
  undefined1 local_2e8 [16];
  TPoolAllocator *local_2d8;
  undefined1 *local_2d0;
  undefined1 local_2c0 [16];
  TPoolAllocator *local_2b0;
  undefined1 *local_2a8;
  undefined1 local_298 [16];
  TPoolAllocator *local_288;
  undefined1 *local_280;
  undefined1 local_270 [16];
  TPoolAllocator *local_260;
  undefined1 *local_258;
  undefined1 local_248 [16];
  TPoolAllocator *local_238;
  undefined1 *local_230;
  undefined1 local_220 [16];
  TPoolAllocator *local_210;
  undefined1 *local_208;
  undefined1 local_1f8 [16];
  TPoolAllocator *local_1e8;
  undefined1 *local_1e0;
  undefined1 local_1d0 [16];
  TPoolAllocator *local_1c0;
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  TPoolAllocator *local_198;
  undefined1 *local_190;
  undefined1 local_180 [16];
  TPoolAllocator *local_170;
  undefined1 *local_168;
  undefined1 local_158 [16];
  TPoolAllocator *local_148;
  undefined1 *local_140;
  undefined1 local_130 [16];
  TPoolAllocator *local_120;
  undefined1 *local_118;
  undefined1 local_108 [16];
  TPoolAllocator *local_f8;
  undefined1 *local_f0;
  undefined1 local_e0 [16];
  TPoolAllocator *local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  TPoolAllocator *local_a8;
  undefined1 *local_a0;
  undefined1 local_90 [16];
  TPoolAllocator *local_80;
  undefined1 *local_78;
  undefined1 local_68 [16];
  TPoolAllocator *local_58;
  undefined1 *local_50;
  undefined1 local_40 [16];
  undefined4 extraout_var_22;
  undefined4 extraout_var_x00147;
  
  language = symbol->stage;
  EVar27 = unitSymbol->stage;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  bVar3 = isIoResizeArray((TType *)CONCAT44(extraout_var,iVar6),language);
  unitStage = EVar27;
  pTVar18 = symbol;
  if (bVar3) {
LAB_0036b8e8:
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar3 = isIoResizeArray((TType *)CONCAT44(extraout_var_01,iVar6),language);
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
    iVar16 = 0;
    uVar21 = 0;
    if (CONCAT44(extraout_var_02,iVar6) != 0) {
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
      lVar20 = *(long *)(CONCAT44(extraout_var_03,iVar6) + 8);
      uVar21 = 0;
      if (lVar20 != 0) {
        uVar21 = (uint)((ulong)(*(long *)(lVar20 + 0x10) - *(long *)(lVar20 + 8)) >> 4);
      }
    }
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    bVar4 = isIoResizeArray((TType *)CONCAT44(extraout_var_04,iVar6),EVar27);
    symbol = pTVar18;
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])
                      (unitSymbol);
    local_428 = infoSink;
    if (CONCAT44(extraout_var_05,iVar6) == 0) {
      lVar20 = 0;
    }
    else {
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])
                        (unitSymbol);
      lVar20 = *(long *)(CONCAT44(extraout_var_06,iVar6) + 8);
      if (lVar20 != 0) {
        iVar16 = (int)((ulong)(*(long *)(lVar20 + 0x10) - *(long *)(lVar20 + 8)) >> 4);
      }
    }
    uVar24 = uVar21 - bVar3;
    cVar25 = uVar24 == iVar16 - (uint)bVar4;
    local_450 = (uint)CONCAT71((int7)((ulong)lVar20 >> 8),cVar25);
    infoSink = local_428;
    EVar27 = unitStage;
    pTVar18 = symbol;
    if (((bool)cVar25) && (uVar21 != bVar3)) {
      uVar21 = 0;
      while( true ) {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])(symbol);
        uVar7 = TSmallArrayVector::getDimSize
                          ((TSmallArrayVector *)CONCAT44(extraout_var_07,iVar6),uVar21 + bVar3);
        iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
        uVar8 = TSmallArrayVector::getDimSize
                          ((TSmallArrayVector *)CONCAT44(extraout_var_08,iVar6),bVar4 + uVar21);
        infoSink = local_428;
        EVar27 = unitStage;
        pTVar18 = symbol;
        if (uVar7 != uVar8) break;
        if ((uVar24 != iVar16 - (uint)bVar4) || (uVar21 = uVar21 + 1, uVar24 <= uVar21))
        goto LAB_0036bb3e;
      }
      cVar25 = '\0';
    }
  }
  else {
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    bVar3 = isIoResizeArray((TType *)CONCAT44(extraout_var_00,iVar6),EVar27);
    if (bVar3) goto LAB_0036b8e8;
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                       (unitSymbol);
    bVar3 = TType::sameArrayness
                      ((TType *)CONCAT44(extraout_var_09,iVar6),
                       (TType *)CONCAT44(extraout_var_10,iVar16));
    cVar25 = '\x01';
    EVar27 = unitStage;
    if (!bVar3) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0xe8))
                        ((long *)CONCAT44(extraout_var_11,iVar6));
      EVar27 = unitStage;
      if (cVar5 != '\0') {
        iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                          (unitSymbol);
        cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 0xe8))
                          ((long *)CONCAT44(extraout_var_12,iVar6));
        if (cVar5 != '\0') {
          iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar6) + 0x100))
                            ((long *)CONCAT44(extraout_var_13,iVar6));
          infoSink = infoSink;
          if (cVar5 == '\0') {
            iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (unitSymbol);
            cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0x100))
                              ((long *)CONCAT44(extraout_var_14,iVar6));
            infoSink = infoSink;
            if (cVar5 == '\0') {
              iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (symbol);
              cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar6) + 0xf8))
                                ((long *)CONCAT44(extraout_var_15,iVar6));
              infoSink = infoSink;
              if (cVar5 == '\0') {
                iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                        )(unitSymbol);
                cVar25 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 0xf8))
                                   ((long *)CONCAT44(extraout_var_16,iVar6));
                infoSink = infoSink;
              }
            }
          }
          goto LAB_0036bb3e;
        }
      }
      cVar25 = '\0';
      infoSink = infoSink;
    }
  }
LAB_0036bb3e:
  lpidx = -1;
  rpidx = -1;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(unitSymbol)
  ;
  lpidx = -1;
  rpidx = -1;
  if ((((TType *)CONCAT44(extraout_var_18,iVar16))->field_0x8 ==
       ((TType *)CONCAT44(extraout_var_17,iVar6))->field_0x8) &&
     (bVar3 = TType::sameElementShape
                        ((TType *)CONCAT44(extraout_var_17,iVar6),
                         (TType *)CONCAT44(extraout_var_18,iVar16),&lpidx,&rpidx), bVar3)) {
    if (cVar25 == '\0') {
      error(this,infoSink,"Array sizes must be compatible:",unitStage);
      local_448 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1);
      local_444 = 0;
      pTVar28 = pTVar18;
    }
    else {
      pTVar28 = pTVar18;
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                         (unitSymbol);
      this_00 = *(TTypeParameters **)(CONCAT44(extraout_var_19,iVar6) + 0x88);
      rhs = *(TTypeParameters **)(CONCAT44(extraout_var_20,iVar16) + 0x88);
      bVar3 = this_00 == (TTypeParameters *)0x0 && rhs == (TTypeParameters *)0x0;
      if ((this_00 != (TTypeParameters *)0x0) && (rhs != (TTypeParameters *)0x0)) {
        bVar3 = TTypeParameters::operator==(this_00,rhs);
      }
      if (bVar3 == false) {
        error(this,infoSink,"Type parameters must match:",unitStage);
        local_448 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_08 >> 8),1);
        local_444 = 0;
      }
      else {
        local_444 = 0;
        local_448 = 0;
      }
    }
  }
  else if ((lpidx | rpidx) < 0) {
    if (rpidx == -1 && -1 < lpidx) {
      pcVar12 = StageName(language);
      local_3f8.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&errmsg,
                 pcVar12,&local_3f8);
      pbVar10 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (&errmsg," block member has no corresponding member in ");
      pcVar12 = StageName(unitStage);
      pbVar10 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (pbVar10,pcVar12);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pbVar10," block:");
      error(this,infoSink,errmsg._M_dataplus._M_p,unitStage);
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar12 = StageName(language);
      TInfoSinkBase::append(&infoSink->info,pcVar12);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      pTVar28 = pTVar18;
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      pTVar13 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_26,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      TInfoSinkBase::append(&infoSink->info,", Member: ");
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      plVar9 = (long *)CONCAT44(extraout_var_27,iVar6);
      cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
      if (cVar25 == '\0') goto LAB_0036de6e;
      pTVar13 = (TString *)
                (**(code **)(**(long **)(*(long *)(plVar9[0xd] + 8) + (long)lpidx * 0x20) + 0x30))()
      ;
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      TInfoSinkBase::append(&infoSink->info,"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar12 = StageName(unitStage);
      TInfoSinkBase::append(&infoSink->info,pcVar12);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitSymbol);
      pTVar13 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_28,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_28,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      pTVar18 = pTVar28;
      TInfoSinkBase::append(&infoSink->info,", Member: n/a \n");
      local_444 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      local_448 = 0;
      pTVar28 = pTVar18;
    }
    else if (lpidx == -1 && -1 < rpidx) {
      pcVar12 = StageName(unitStage);
      local_3f8.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&errmsg,
                 pcVar12,&local_3f8);
      pbVar10 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (&errmsg," block member has no corresponding member in ");
      pcVar12 = StageName(language);
      pbVar10 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (pbVar10,pcVar12);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pbVar10," block:");
      error(this,infoSink,errmsg._M_dataplus._M_p,unitStage);
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar12 = StageName(unitStage);
      TInfoSinkBase::append(&infoSink->info,pcVar12);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitSymbol);
      pTVar13 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_29,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      TInfoSinkBase::append(&infoSink->info,", Member: ");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitSymbol);
      plVar9 = (long *)CONCAT44(extraout_var_30,iVar6);
      cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
      if (cVar25 == '\0') goto LAB_0036de6e;
      pTVar13 = (TString *)
                (**(code **)(**(long **)(*(long *)(plVar9[0xd] + 8) + (long)rpidx * 0x20) + 0x30))()
      ;
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      TInfoSinkBase::append(&infoSink->info,"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar12 = StageName(language);
      TInfoSinkBase::append(&infoSink->info,pcVar12);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      pTVar28 = pTVar18;
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      pTVar13 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_31,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_31,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      unitStage = EVar27;
      TInfoSinkBase::append(&infoSink->info,", Member: n/a \n");
      local_444 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
      local_448 = 0;
      EVar27 = unitStage;
    }
    else {
      error(this,infoSink,"Types must match:",unitStage);
      local_448 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
      local_444 = 0;
      pTVar28 = pTVar18;
    }
  }
  else {
    error(this,infoSink,"Member names and types must match:",unitStage);
    TInfoSinkBase::append(&infoSink->info,"    Block: ");
    pTVar28 = pTVar18;
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
    pTVar13 = (TString *)
              (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar6) + 0x28))
                        ((long *)CONCAT44(extraout_var_21,iVar6));
    TInfoSinkBase::append(&infoSink->info,pTVar13);
    TInfoSinkBase::append(&infoSink->info,"\n");
    TInfoSinkBase::append(&infoSink->info,"        ");
    pcVar12 = StageName(language);
    TInfoSinkBase::append(&infoSink->info,pcVar12);
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
    plVar9 = (long *)CONCAT44(extraout_var_22,iVar6);
    cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
    if (cVar25 == '\0') goto LAB_0036de6e;
    pTVar14 = *(TType **)(*(long *)(plVar9[0xd] + 8) + (long)lpidx * 0x20);
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
    plVar9 = (long *)CONCAT44(extraout_var_23,iVar6);
    cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
    if (cVar25 == '\0') goto LAB_0036de6e;
    lVar20 = (**(code **)(**(long **)(*(long *)(plVar9[0xd] + 8) + (long)lpidx * 0x20) + 0x30))();
    local_58 = GetThreadPoolAllocator();
    local_50 = local_40;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_58,*(long *)(lVar20 + 8),
                        *(long *)(lVar20 + 0x10) + *(long *)(lVar20 + 8));
    local_80 = GetThreadPoolAllocator();
    local_78 = local_68;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_80,
               "");
    name._M_dataplus._M_p = (pointer)&local_80;
    name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_58;
    name._M_string_length._0_4_ = in_stack_fffffffffffffb88;
    name._M_string_length._4_4_ = EVar27;
    name.field_2._M_allocated_capacity = (size_type)this;
    name.field_2._8_4_ = (int)pTVar28;
    name.field_2._12_4_ = (int)((ulong)pTVar28 >> 0x20);
    structName._M_dataplus._M_p._0_4_ = uStack_458;
    structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
    structName._M_dataplus._M_p._4_4_ = language;
    structName._M_string_length._0_4_ = local_450;
    structName._M_string_length._4_4_ = uStack_44c;
    structName.field_2._M_allocated_capacity._0_4_ = local_448;
    structName.field_2._M_allocated_capacity._4_4_ = local_444;
    structName.field_2._8_4_ = rpidx;
    structName.field_2._12_4_ = lpidx;
    TType::getCompleteString(&errmsg,pTVar14,true,false,false,true,name,structName);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    TInfoSinkBase::append(&infoSink->info,"        ");
    pcVar12 = StageName(EVar27);
    TInfoSinkBase::append(&infoSink->info,pcVar12);
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    plVar9 = (long *)CONCAT44(extraout_var_24,iVar6);
    cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
    if (cVar25 == '\0') goto LAB_0036de6e;
    pTVar14 = *(TType **)(*(long *)(plVar9[0xd] + 8) + (long)rpidx * 0x20);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    plVar9 = (long *)CONCAT44(extraout_var_25,iVar6);
    cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
    if (cVar25 == '\0') goto LAB_0036de6e;
    lVar20 = (**(code **)(**(long **)(*(long *)(plVar9[0xd] + 8) + (long)rpidx * 0x20) + 0x30))();
    local_a8 = GetThreadPoolAllocator();
    local_a0 = local_90;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_a8,*(long *)(lVar20 + 8),
                        *(long *)(lVar20 + 0x10) + *(long *)(lVar20 + 8));
    local_d0 = GetThreadPoolAllocator();
    local_c8 = local_b8;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_d0,
               "");
    local_448 = 0;
    name_00._M_dataplus._M_p = (pointer)&local_d0;
    name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_a8;
    name_00._M_string_length._0_4_ = in_stack_fffffffffffffb88;
    name_00._M_string_length._4_4_ = EVar27;
    name_00.field_2._M_allocated_capacity = (size_type)this;
    name_00.field_2._8_4_ = (int)pTVar28;
    name_00.field_2._12_4_ = (int)((ulong)pTVar28 >> 0x20);
    structName_00._M_dataplus._M_p._0_4_ = uStack_458;
    structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
    structName_00._M_dataplus._M_p._4_4_ = language;
    structName_00._M_string_length._0_4_ = local_450;
    structName_00._M_string_length._4_4_ = uStack_44c;
    structName_00.field_2._M_allocated_capacity._0_4_ = 0;
    structName_00.field_2._M_allocated_capacity._4_4_ = local_444;
    structName_00.field_2._8_4_ = rpidx;
    structName_00.field_2._12_4_ = lpidx;
    TType::getCompleteString(&errmsg,pTVar14,true,false,false,true,name_00,structName_00);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    unitStage = EVar27;
    pTVar18 = pTVar28;
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    local_444 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    EVar27 = unitStage;
    pTVar28 = pTVar18;
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
  iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_32,iVar6) + 0x38))
                    ((long *)CONCAT44(extraout_var_32,iVar6));
  if (iVar6 == 0x10) {
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_33,iVar6) + 0x38))
                      ((long *)CONCAT44(extraout_var_33,iVar6));
    if (iVar6 == 0x10) {
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      plVar9 = (long *)CONCAT44(extraout_var_34,iVar6);
      unitStage = EVar27;
      cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
      if (cVar25 == '\0') goto LAB_0036de6e;
      EVar27 = unitStage;
      if (plVar9[0xd] != 0) {
        iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                          (unitSymbol);
        plVar9 = (long *)CONCAT44(extraout_var_35,iVar6);
        cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
        if (cVar25 == '\0') goto LAB_0036de6e;
        EVar27 = unitStage;
        if (plVar9[0xd] != 0) {
          iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar18);
          iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                             (unitSymbol);
          bVar3 = TType::sameStructType
                            ((TType *)CONCAT44(extraout_var_36,iVar6),
                             (TType *)CONCAT44(extraout_var_37,iVar16),(int *)0x0,(int *)0x0);
          EVar27 = unitStage;
          if (bVar3) {
            iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar18);
            plVar9 = (long *)CONCAT44(extraout_var_38,iVar6);
            cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
            if (cVar25 != '\0') {
              local_450 = 0;
              uVar21 = 0;
              do {
                uStack_44c = 0;
                local_438 = (TType *)((ulong)local_450 << 5);
                while( true ) {
                  EVar27 = unitStage;
                  if ((ulong)(*(long *)(plVar9[0xd] + 0x10) - *(long *)(plVar9[0xd] + 8) >> 5) <=
                      (ulong)local_450) goto LAB_0036ca2c;
                  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                            [0x1e])(unitSymbol);
                  plVar9 = (long *)CONCAT44(extraout_var_39,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  pTVar14 = local_438;
                  if (cVar25 == '\0') goto LAB_0036de6e;
                  EVar27 = unitStage;
                  if ((ulong)(*(long *)(plVar9[0xd] + 0x10) - *(long *)(plVar9[0xd] + 8) >> 5) <=
                      (ulong)uVar21) goto LAB_0036ca2c;
                  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                    (pTVar18);
                  plVar9 = (long *)CONCAT44(extraout_var_40,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  if (cVar25 == '\0') goto LAB_0036de6e;
                  cVar25 = (**(code **)(**(long **)((long)&pTVar14->_vptr_TType +
                                                   *(long *)(plVar9[0xd] + 8)) + 0x18))();
                  if (cVar25 != '\0') goto LAB_0036c9ed;
                  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                            [0x1e])();
                  plVar9 = (long *)CONCAT44(extraout_var_41,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  if (cVar25 == '\0') goto LAB_0036de6e;
                  lVar20 = (ulong)uVar21 * 0x20;
                  cVar25 = (**(code **)(**(long **)(*(long *)(plVar9[0xd] + 8) + lVar20) + 0x18))();
                  if (cVar25 == '\0') break;
                  uVar21 = uVar21 + 1;
                  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                    (pTVar18);
                  plVar9 = (long *)CONCAT44(extraout_var_42,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  if (cVar25 == '\0') goto LAB_0036de6e;
                }
                iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar18);
                plVar9 = (long *)CONCAT44(extraout_var_43,iVar6);
                cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                if (cVar25 == '\0') break;
                lVar11 = (**(code **)(**(long **)((long)&pTVar14->_vptr_TType +
                                                 *(long *)(plVar9[0xd] + 8)) + 0x50))();
                iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                        )();
                plVar9 = (long *)CONCAT44(extraout_var_44,iVar6);
                cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                if (cVar25 == '\0') break;
                local_430 = (**(code **)(**(long **)(*(long *)(plVar9[0xd] + 8) + lVar20) + 0x50))()
                ;
                uVar15 = *(ulong *)(local_430 + 8) ^ *(ulong *)(lVar11 + 8);
                if (0x1fffffffffffffff < uVar15) {
                  error(this,infoSink,"Interface block member layout matrix qualifier must match:",
                        unitStage);
                }
                bVar3 = *(int *)(lVar11 + 0x14) != *(int *)(local_430 + 0x14);
                if (bVar3) {
                  error(this,infoSink,"Interface block member layout offset qualifier must match:",
                        unitStage);
                }
                bVar4 = *(int *)(lVar11 + 0x18) != *(int *)(local_430 + 0x18);
                if (bVar4) {
                  error(this,infoSink,"Interface block member layout align qualifier must match:",
                        unitStage);
                }
                bVar26 = ((*(uint *)(local_430 + 0x1c) ^ *(uint *)(lVar11 + 0x1c)) & 0xfff) != 0;
                pTVar18 = pTVar28;
                if (bVar26) {
                  error(this,infoSink,"Interface block member layout location qualifier must match:"
                        ,unitStage);
                }
                if (((*(uint *)(local_430 + 0x1c) ^ *(uint *)(lVar11 + 0x1c)) & 0x7000) == 0) {
                  pTVar28 = pTVar18;
                  if (bVar26 || (bVar4 || (bVar3 || 0x1fffffffffffffff < uVar15)))
                  goto LAB_0036c6a2;
                }
                else {
                  error(this,infoSink,
                        "Interface block member layout component qualifier must match:",unitStage);
LAB_0036c6a2:
                  pTVar28 = pTVar18;
                  TInfoSinkBase::append(&infoSink->info,"    ");
                  pcVar12 = StageName(language);
                  TInfoSinkBase::append(&infoSink->info,pcVar12);
                  TInfoSinkBase::append(&infoSink->info," stage: Block: ");
                  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                    (pTVar18);
                  pTVar13 = (TString *)
                            (**(code **)(*(long *)CONCAT44(extraout_var_45,iVar6) + 0x28))
                                      ((long *)CONCAT44(extraout_var_45,iVar6));
                  TInfoSinkBase::append(&infoSink->info,pTVar13);
                  TInfoSinkBase::append(&infoSink->info,", Member: ");
                  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                    (pTVar18);
                  plVar9 = (long *)CONCAT44(extraout_var_46,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  if (cVar25 == '\0') break;
                  pTVar13 = (TString *)
                            (**(code **)(**(long **)((long)&pTVar14->_vptr_TType +
                                                    *(long *)(plVar9[0xd] + 8)) + 0x30))();
                  TInfoSinkBase::append(&infoSink->info,pTVar13);
                  TInfoSinkBase::append(&infoSink->info," \"");
                  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                    (pTVar18);
                  plVar9 = (long *)CONCAT44(extraout_var_47,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  if (cVar25 == '\0') break;
                  local_438 = *(TType **)((long)&pTVar14->_vptr_TType + *(long *)(plVar9[0xd] + 8));
                  local_3c8 = GetThreadPoolAllocator();
                  local_3c0 = local_3b0;
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  _M_construct<char_const*>
                            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                              *)&local_3c8,"","");
                  local_378 = GetThreadPoolAllocator();
                  local_370 = local_360;
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  _M_construct<char_const*>
                            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                              *)&local_378,"","");
                  name_01._M_dataplus._M_p = (pointer)&local_378;
                  name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_3c8;
                  name_01._M_string_length._0_4_ = in_stack_fffffffffffffb88;
                  name_01._M_string_length._4_4_ = unitStage;
                  name_01.field_2._M_allocated_capacity = (size_type)this;
                  name_01.field_2._8_4_ = (int)pTVar28;
                  name_01.field_2._12_4_ = (int)((ulong)pTVar28 >> 0x20);
                  structName_01._M_dataplus._M_p._0_4_ = uStack_458;
                  structName_01._M_dataplus.super_allocator_type.allocator =
                       (TPoolAllocator *)unitSymbol;
                  structName_01._M_dataplus._M_p._4_4_ = language;
                  structName_01._M_string_length._0_4_ = local_450;
                  structName_01._M_string_length._4_4_ = 0;
                  structName_01.field_2._M_allocated_capacity._0_4_ = local_448;
                  structName_01.field_2._M_allocated_capacity._4_4_ = local_444;
                  structName_01.field_2._8_4_ = rpidx;
                  structName_01.field_2._12_4_ = lpidx;
                  TType::getCompleteString
                            (&errmsg,local_438,true,true,false,false,name_01,structName_01);
                  TInfoSinkBase::append(&infoSink->info,&errmsg);
                  TInfoSinkBase::append(&infoSink->info,"\"\n");
                  TInfoSinkBase::append(&infoSink->info,"    ");
                  pcVar12 = StageName(unitStage);
                  TInfoSinkBase::append(&infoSink->info,pcVar12);
                  TInfoSinkBase::append(&infoSink->info," stage: Block: ");
                  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                            [0x1e])(unitSymbol);
                  pTVar13 = (TString *)
                            (**(code **)(*(long *)CONCAT44(extraout_var_48,iVar6) + 0x28))
                                      ((long *)CONCAT44(extraout_var_48,iVar6));
                  TInfoSinkBase::append(&infoSink->info,pTVar13);
                  TInfoSinkBase::append(&infoSink->info,", Member: ");
                  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                            [0x1e])(unitSymbol);
                  plVar9 = (long *)CONCAT44(extraout_var_49,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  if (cVar25 == '\0') break;
                  pTVar13 = (TString *)
                            (**(code **)(**(long **)(*(long *)(plVar9[0xd] + 8) + lVar20) + 0x30))()
                  ;
                  TInfoSinkBase::append(&infoSink->info,pTVar13);
                  TInfoSinkBase::append(&infoSink->info," \"");
                  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                            [0x1e])(unitSymbol);
                  plVar9 = (long *)CONCAT44(extraout_var_50,iVar6);
                  cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
                  if (cVar25 == '\0') break;
                  pTVar14 = *(TType **)(*(long *)(plVar9[0xd] + 8) + lVar20);
                  local_3f0 = GetThreadPoolAllocator();
                  local_3e8 = local_3d8;
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  _M_construct<char_const*>
                            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                              *)&local_3f0,"","");
                  local_3a0 = GetThreadPoolAllocator();
                  local_398 = local_388;
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  _M_construct<char_const*>
                            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                              *)&local_3a0,"","");
                  name_02._M_dataplus._M_p = (pointer)&local_3a0;
                  name_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_3f0;
                  name_02._M_string_length._0_4_ = in_stack_fffffffffffffb88;
                  name_02._M_string_length._4_4_ = unitStage;
                  name_02.field_2._M_allocated_capacity = (size_type)this;
                  name_02.field_2._8_4_ = (int)pTVar28;
                  name_02.field_2._12_4_ = (int)((ulong)pTVar28 >> 0x20);
                  structName_02._M_dataplus._M_p._0_4_ = uStack_458;
                  structName_02._M_dataplus.super_allocator_type.allocator =
                       (TPoolAllocator *)unitSymbol;
                  structName_02._M_dataplus._M_p._4_4_ = language;
                  structName_02._M_string_length._0_4_ = local_450;
                  structName_02._M_string_length._4_4_ = 0;
                  structName_02.field_2._M_allocated_capacity._0_4_ = local_448;
                  structName_02.field_2._M_allocated_capacity._4_4_ = local_444;
                  structName_02.field_2._8_4_ = rpidx;
                  structName_02.field_2._12_4_ = lpidx;
                  TType::getCompleteString
                            (&errmsg,pTVar14,true,true,false,false,name_02,structName_02);
                  TInfoSinkBase::append(&infoSink->info,&errmsg);
                  TInfoSinkBase::append(&infoSink->info,"\"\n");
                  local_444 = (uint)CONCAT71((int7)((ulong)extraout_RAX_04 >> 8),1);
                }
                uVar21 = uVar21 + 1;
LAB_0036c9ed:
                local_450 = local_450 + 1;
                iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar18);
                plVar9 = (long *)CONCAT44(extraout_var_51,iVar6);
                cVar25 = (**(code **)(*plVar9 + 0x128))(plVar9);
              } while (cVar25 != '\0');
            }
            goto LAB_0036de6e;
          }
        }
      }
    }
  }
LAB_0036ca2c:
  if (language == unitStage) {
LAB_0036ca9a:
    bVar3 = false;
  }
  else {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
    if ((*(uint *)(CONCAT44(extraout_var_52,iVar6) + 8) & 0x7f) == 3) {
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      bVar3 = true;
      if ((*(uint *)(CONCAT44(extraout_var_53,iVar6) + 8) & 0x7f) != 4) goto LAB_0036ca65;
    }
    else {
LAB_0036ca65:
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
      if ((*(uint *)(CONCAT44(extraout_var_54,iVar6) + 8) & 0x7f) != 4) goto LAB_0036ca9a;
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      bVar3 = (*(uint *)(CONCAT44(extraout_var_55,iVar6) + 8) & 0x7f) == 3;
    }
  }
  cVar25 = (char)local_448;
  if (bVar3) {
LAB_0036caec:
    local_438 = (TType *)((ulong)local_438 & 0xffffffff00000000);
    local_450 = CONCAT31(local_450._1_3_,cVar25);
  }
  else {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
    uVar21 = *(uint *)(CONCAT44(extraout_var_56,iVar6) + 8);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_57,iVar6) + 8)) & 0x7f) == 0) goto LAB_0036caec;
    error(this,infoSink,"Storage qualifiers must match:",unitStage);
    local_438 = (TType *)CONCAT44(local_438._4_4_,
                                  (int)CONCAT71((int7)((ulong)extraout_RAX_05 >> 8),1));
    local_450 = CONCAT31(local_450._1_3_,1);
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  if ((*(uint *)(CONCAT44(extraout_var_58,iVar6) + 8) & 0x7f) - 5 < 2) {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var_59,iVar6),0,5,"anon@");
    iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    pTVar18 = pTVar28;
    iVar16 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_60,iVar16),0,5,"anon@");
    pTVar28 = pTVar18;
    if ((iVar6 == 0) != (iVar16 == 0)) {
      error(this,infoSink,
            "Matched Uniform or Storage blocks must all be anonymous, or all be named:",unitStage);
      local_450 = CONCAT31(local_450._1_3_,1);
    }
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar21 = *(uint *)(CONCAT44(extraout_var_61,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_62,iVar6) + 8)) & 0x7f) == 0) {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var_63,iVar6),0,5,"anon@");
    iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                       (unitSymbol);
    pTVar18 = pTVar28;
    iVar16 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_64,iVar16),0,5,"anon@");
    pTVar28 = pTVar18;
    if ((iVar16 == 0) == (iVar6 == 0)) {
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_65,iVar6),0,5,"anon@");
      if (iVar6 != 0) {
        iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
        iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_66,iVar6),
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_67,iVar16));
        if (iVar6 != 0) goto LAB_0036cc68;
      }
    }
    else {
LAB_0036cc68:
      warn(this,infoSink,"Matched shader interfaces are using different instance names.",unitStage);
      local_450 = CONCAT31(local_450._1_3_,1);
    }
  }
  if (bVar3) {
    uVar23 = 0;
  }
  else {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
    uVar21 = *(uint *)(CONCAT44(extraout_var_68,iVar6) + 8);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                      (unitSymbol);
    if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_69,iVar6) + 8)) & 0xe000000) == 0) {
      uVar23 = 0;
    }
    else {
      error(this,infoSink,"Precision qualifiers must match:",unitStage);
      uVar23 = CONCAT71((int7)((ulong)unitSymbol >> 8),1);
      local_450 = CONCAT31(local_450._1_3_,1);
    }
  }
  uVar22 = (undefined4)uVar23;
  if (language == unitStage) {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
    uVar21 = *(uint *)(CONCAT44(extraout_var_70,iVar6) + 8);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                      (unitSymbol);
    if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_71,iVar6) + 8)) >> 0x1c & 1) != 0) {
      error(this,infoSink,"Presence of invariant qualifier must match:",unitStage);
      local_438 = (TType *)CONCAT44(local_438._4_4_,
                                    (int)CONCAT71((int7)((ulong)extraout_RAX_06 >> 8),1));
      local_450 = CONCAT31(local_450._1_3_,1);
    }
  }
  if (language == unitStage) {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
    uVar2 = *(undefined8 *)(CONCAT44(extraout_var_72,iVar6) + 8);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                      (unitSymbol);
    if (((byte)(uint)((ulong)uVar2 >> 0x24) & 1) !=
        (*(byte *)(CONCAT44(extraout_var_73,iVar6) + 0xc) & 0x10) >> 4) {
      error(this,infoSink,"Presence of precise qualifier must match:",unitStage);
      uVar22 = (undefined4)CONCAT71((int7)((ulong)uVar23 >> 8),1);
      local_450 = CONCAT31(local_450._1_3_,1);
    }
  }
  if (language == unitStage) {
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
    uVar21 = *(uint *)(CONCAT44(extraout_var_74,iVar6) + 8);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                      (unitSymbol);
    if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_75,iVar6) + 8)) >> 0x1d & 1) == 0) {
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
      uVar21 = *(uint *)(CONCAT44(extraout_var_76,iVar6) + 8);
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                        (unitSymbol);
      if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_77,iVar6) + 8)) >> 0x1e & 1) == 0) {
        iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
        iVar6 = *(int *)(CONCAT44(extraout_var_78,iVar6) + 8);
        iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                           (unitSymbol);
        if (iVar6 < 0 != ((*(byte *)(CONCAT44(extraout_var_79,iVar16) + 0xb) & 0x80) == 0)) {
          iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                            (pTVar18);
          uVar23 = *(undefined8 *)(CONCAT44(extraout_var_80,iVar6) + 8);
          iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                            (unitSymbol);
          if (((byte)(uint)((ulong)uVar23 >> 0x2d) & 1) ==
              (*(byte *)(CONCAT44(extraout_var_81,iVar6) + 0xd) & 0x20) >> 5) {
            iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                              (pTVar18);
            uVar23 = *(undefined8 *)(CONCAT44(extraout_var_82,iVar6) + 8);
            iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                              (unitSymbol);
            if (((byte)(uint)((ulong)uVar23 >> 0x2c) & 1) ==
                (*(byte *)(CONCAT44(extraout_var_83,iVar6) + 0xd) & 0x10) >> 4) {
              iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                                (pTVar18);
              uVar23 = *(undefined8 *)(CONCAT44(extraout_var_84,iVar6) + 8);
              iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                                (unitSymbol);
              if (((byte)(uint)((ulong)uVar23 >> 0x25) & 1) ==
                  (*(byte *)(CONCAT44(extraout_var_85,iVar6) + 0xc) & 0x20) >> 5) goto LAB_0036ced4;
            }
          }
        }
      }
    }
    error(this,infoSink,"Interpolation and auxiliary storage qualifiers must match:",unitStage);
    local_438 = (TType *)CONCAT44(local_438._4_4_,
                                  (int)CONCAT71((int7)((ulong)extraout_RAX_07 >> 8),1));
    local_450 = CONCAT31(local_450._1_3_,1);
  }
LAB_0036ced4:
  local_430 = CONCAT44(local_430._4_4_,uVar22);
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_86,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  uVar15 = (uVar15 ^ *(ulong *)(CONCAT44(extraout_var_87,iVar6) + 8)) & 0x2000000000000;
  cVar5 = (char)(uVar15 >> 0x31);
  if (uVar15 != 0) {
    error(this,infoSink,"Memory coherent qualifier must match:",unitStage);
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_88,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_89,iVar6) + 8)) >> 0x34 & 1) != 0) {
    error(this,infoSink,"Memory devicecoherent qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_90,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_91,iVar6) + 8)) >> 0x35 & 1) != 0) {
    error(this,infoSink,"Memory queuefamilycoherent qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_92,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_93,iVar6) + 8)) >> 0x36 & 1) != 0) {
    error(this,infoSink,"Memory workgroupcoherent qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_94,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_95,iVar6) + 8)) >> 0x37 & 1) != 0) {
    error(this,infoSink,"Memory subgroupcoherent qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_96,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_97,iVar6) + 8)) >> 0x38 & 1) != 0) {
    error(this,infoSink,"Memory shadercallcoherent qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_98,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_99,iVar6) + 8)) >> 0x39 & 1) != 0) {
    error(this,infoSink,"Memory nonprivate qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_x00100,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_x00101,iVar6) + 8)) >> 0x32 & 1) != 0) {
    error(this,infoSink,"Memory volatil qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_x00102,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_x00103,iVar6) + 8)) >> 0x33 & 1) != 0) {
    error(this,infoSink,"Memory nontemporal qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_x00104,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_x00105,iVar6) + 8)) >> 0x2e & 1) != 0) {
    error(this,infoSink,"Memory restrict qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_x00106,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_x00107,iVar6) + 8)) >> 0x2f & 1) != 0) {
    error(this,infoSink,"Memory readonly qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_x00108,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_x00109,iVar6) + 8)) >> 0x30 & 1) != 0) {
    error(this,infoSink,"Memory writeonly qualifier must match:",unitStage);
    cVar5 = '\x01';
  }
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar18);
  uVar15 = *(ulong *)(CONCAT44(extraout_var_x00110,iVar6) + 8);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  bVar3 = 0x1fffffffffffffff < (uVar15 ^ *(ulong *)(CONCAT44(extraout_var_x00111,iVar6) + 8));
  if (bVar3) {
    error(this,infoSink,"Layout matrix qualifier must match:",unitStage);
  }
  iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar1 = *(byte *)(CONCAT44(extraout_var_x00112,iVar6) + 0x10);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  bVar4 = ((bVar1 ^ *(byte *)(CONCAT44(extraout_var_x00113,iVar6) + 0x10)) & 0xf) != 0;
  if (bVar4) {
    error(this,infoSink,"Layout packing qualifier must match:",unitStage);
  }
  bVar4 = bVar4 || bVar3;
  iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((~*(uint *)(CONCAT44(extraout_var_x00114,iVar6) + 0x1c) & 0xfff) != 0) &&
     (iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                        (unitSymbol),
     (~*(uint *)(CONCAT44(extraout_var_x00115,iVar6) + 0x1c) & 0xfff) != 0)) {
    iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar21 = *(uint *)(CONCAT44(extraout_var_x00116,iVar6) + 0x1c);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                      (unitSymbol);
    if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_x00117,iVar6) + 0x1c)) & 0xfff) != 0) {
      error(this,infoSink,"Layout location qualifier must match:",unitStage);
      bVar4 = true;
    }
  }
  iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(uint *)(CONCAT44(extraout_var_x00118,iVar6) + 0x1c);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_x00119,iVar6) + 0x1c)) & 0x7000) != 0) {
    error(this,infoSink,"Layout component qualifier must match:",unitStage);
    bVar4 = true;
  }
  iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar23 = *(undefined8 *)(CONCAT44(extraout_var_x00120,iVar6) + 0x1c);
  iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(unitSymbol);
  if ((char)((ulong)uVar23 >> 0x30) !=
      (char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00121,iVar6) + 0x1c) >> 0x30)) {
    error(this,infoSink,"Layout index qualifier must match:",unitStage);
    bVar4 = true;
  }
  iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((~*(ulong *)(CONCAT44(extraout_var_x00122,iVar6) + 0x1c) & 0xffff00000000) != 0) &&
     (unitStage = EVar27,
     iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                       (unitSymbol), EVar27 = unitStage,
     (~*(ulong *)(CONCAT44(extraout_var_x00123,iVar6) + 0x1c) & 0xffff00000000) != 0)) {
    iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar15 = *(ulong *)(CONCAT44(extraout_var_x00124,iVar6) + 0x1c);
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                      (unitSymbol);
    EVar27 = unitStage;
    if (((uVar15 ^ *(ulong *)(CONCAT44(extraout_var_x00125,iVar6) + 0x1c)) & 0xffff00000000) != 0) {
      error(this,infoSink,"Layout binding qualifier must match:",unitStage);
      bVar4 = true;
    }
  }
  pTVar18 = pTVar28;
  iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar28);
  if ((~*(ulong *)(CONCAT44(extraout_var_x00126,iVar6) + 0x1c) & 0xffff00000000) == 0) {
    uVar21 = (uint)local_438;
  }
  else {
    iVar6 = (*(pTVar28->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar28);
    iVar6 = *(int *)(CONCAT44(extraout_var_x00127,iVar6) + 0x14);
    iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar21 = (uint)local_438;
    if (iVar6 != *(int *)(CONCAT44(extraout_var_x00128,iVar16) + 0x14)) {
      error(this,infoSink,"Layout offset qualifier must match:",unitStage);
      bVar4 = true;
    }
  }
  uVar24 = 1;
  if ((!bVar4 && cVar5 == '\0') && (uVar24 = uVar21 & 0xff, (char)local_450 == '\0')) {
    if ((local_444 & 1) != 0) {
      return;
    }
    if ((pTVar18->constArray).unionArray == (TConstUnionVector *)0x0) {
      return;
    }
    if ((unitSymbol->constArray).unionArray == (TConstUnionVector *)0x0) {
      return;
    }
    bVar3 = TConstUnionArray::operator==(&pTVar18->constArray,&unitSymbol->constArray);
    if (bVar3) {
      return;
    }
    error(this,infoSink,"Initializers must match:",unitStage);
    TInfoSinkBase::append(&infoSink->info,"    ");
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
    TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00129,iVar6));
    pcVar12 = "\n";
    goto LAB_0036dc08;
  }
  pTVar28 = pTVar18;
  iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
  iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_x00130,iVar6) + 0x38))
                    ((long *)CONCAT44(extraout_var_x00130,iVar6));
  bVar3 = SUB41(uVar24,0);
  if (iVar6 == 0x10) {
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_x00131,iVar6) + 0x38))
                      ((long *)CONCAT44(extraout_var_x00131,iVar6));
    if (iVar6 != 0x10) goto LAB_0036d829;
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
    plVar9 = (long *)CONCAT44(extraout_var_x00132,iVar6);
    cVar5 = (**(code **)(*plVar9 + 0x128))(plVar9);
    if (cVar5 == '\0') {
LAB_0036de6e:
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    if (plVar9[0xd] == 0) goto LAB_0036d829;
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    plVar9 = (long *)CONCAT44(extraout_var_x00133,iVar6);
    cVar5 = (**(code **)(*plVar9 + 0x128))(plVar9);
    if (cVar5 == '\0') goto LAB_0036de6e;
    if (plVar9[0xd] == 0) goto LAB_0036d829;
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar12 = StageName(language);
    TInfoSinkBase::append(&infoSink->info,pcVar12);
    if (cVar25 == '\0') {
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      pTVar13 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_x00148,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_x00148,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      TInfoSinkBase::append(&infoSink->info," Instance: ");
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00149,iVar6));
      TInfoSinkBase::append(&infoSink->info,": \"");
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      local_148 = GetThreadPoolAllocator();
      uVar22 = (undefined4)((ulong)pTVar28 >> 0x20);
      local_140 = local_130;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_148,"","");
      local_170 = GetThreadPoolAllocator();
      local_168 = local_158;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_170,"","");
      uVar21 = (uint)local_430._0_1_;
      name_09._M_dataplus._M_p = (pointer)&local_170;
      name_09._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_148;
      name_09._M_string_length._0_4_ = in_stack_fffffffffffffb88;
      name_09._M_string_length._4_4_ = EVar27;
      name_09.field_2._M_allocated_capacity = (size_type)this;
      name_09.field_2._M_local_buf[8] = local_430._0_1_;
      name_09.field_2._9_3_ = 0;
      name_09.field_2._12_4_ = uVar22;
      structName_09._M_dataplus._M_p._0_4_ = uStack_458;
      structName_09._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
      structName_09._M_dataplus._M_p._4_4_ = language;
      structName_09._M_string_length._0_4_ = local_450;
      structName_09._M_string_length._4_4_ = uStack_44c;
      structName_09.field_2._M_allocated_capacity._0_4_ = local_448;
      structName_09.field_2._M_allocated_capacity._4_4_ = local_444;
      structName_09.field_2._8_4_ = rpidx;
      structName_09.field_2._12_4_ = lpidx;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00150,iVar6),true,bVar3,local_430._0_1_,
                 false,name_09,structName_09);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar12 = StageName(EVar27);
      TInfoSinkBase::append(&infoSink->info,pcVar12);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitSymbol);
      pTVar13 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_x00151,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_x00151,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar13);
      TInfoSinkBase::append(&infoSink->info," Instance: ");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                        (unitSymbol);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00152,iVar6));
      TInfoSinkBase::append(&infoSink->info,": \"");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitSymbol);
      pTVar14 = (TType *)CONCAT44(extraout_var_x00153,iVar6);
      local_198 = GetThreadPoolAllocator();
      local_190 = local_180;
      pbVar17 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_198;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar17,"");
      local_1c0 = GetThreadPoolAllocator();
      local_1b8 = local_1a8;
      pbVar19 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_1c0;
      goto LAB_0036dbbf;
    }
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
    iVar16 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
    local_328 = GetThreadPoolAllocator();
    lVar20 = *(long *)(CONCAT44(extraout_var_x00135,iVar16) + 8);
    local_320 = local_310;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_328,lVar20,
                        *(long *)(CONCAT44(extraout_var_x00135,iVar16) + 0x10) + lVar20);
    uVar22 = (undefined4)((ulong)pTVar28 >> 0x20);
    iVar16 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
    lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_x00136,iVar16) + 0x28))
                       ((long *)CONCAT44(extraout_var_x00136,iVar16));
    local_f8 = GetThreadPoolAllocator();
    local_f0 = local_e0;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_f8,*(long *)(lVar20 + 8),
                        *(long *)(lVar20 + 0x10) + *(long *)(lVar20 + 8));
    bVar4 = local_430._0_1_;
    name_03._M_dataplus._M_p = (pointer)&local_f8;
    name_03._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_328;
    name_03._M_string_length._0_4_ = in_stack_fffffffffffffb88;
    name_03._M_string_length._4_4_ = EVar27;
    name_03.field_2._M_allocated_capacity = (size_type)this;
    name_03.field_2._8_4_ = uVar24;
    name_03.field_2._12_4_ = uVar22;
    structName_03._M_dataplus._M_p._0_4_ = uStack_458;
    structName_03._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
    structName_03._M_dataplus._M_p._4_4_ = language;
    structName_03._M_string_length._0_4_ = local_450;
    structName_03._M_string_length._4_4_ = uStack_44c;
    structName_03.field_2._M_allocated_capacity._0_4_ = local_448;
    structName_03.field_2._M_allocated_capacity._4_4_ = local_444;
    structName_03.field_2._8_4_ = rpidx;
    structName_03.field_2._12_4_ = lpidx;
    TType::getCompleteString
              (&errmsg,(TType *)CONCAT44(extraout_var_x00134,iVar6),true,bVar3,local_430._0_1_,true,
               name_03,structName_03);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar12 = StageName(EVar27);
    TInfoSinkBase::append(&infoSink->info,pcVar12);
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                       (unitSymbol);
    local_350 = GetThreadPoolAllocator();
    lVar20 = *(long *)(CONCAT44(extraout_var_x00138,iVar16) + 8);
    local_348 = local_338;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_350,lVar20,
                        *(long *)(CONCAT44(extraout_var_x00138,iVar16) + 0x10) + lVar20);
    iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                       (unitSymbol);
    lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_x00139,iVar16) + 0x28))
                       ((long *)CONCAT44(extraout_var_x00139,iVar16));
    local_120 = GetThreadPoolAllocator();
    local_118 = local_108;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_120,*(long *)(lVar20 + 8),
                        *(long *)(lVar20 + 0x10) + *(long *)(lVar20 + 8));
    name_04._M_dataplus._M_p = (pointer)&local_120;
    name_04._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_350;
    name_04._M_string_length._0_4_ = in_stack_fffffffffffffb88;
    name_04._M_string_length._4_4_ = EVar27;
    name_04.field_2._M_allocated_capacity = (size_type)this;
    name_04.field_2._8_4_ = uVar24;
    name_04.field_2._12_4_ = uVar22;
    structName_04._M_dataplus._M_p._0_4_ = uStack_458;
    structName_04._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
    structName_04._M_dataplus._M_p._4_4_ = language;
    structName_04._M_string_length._0_4_ = local_450;
    structName_04._M_string_length._4_4_ = uStack_44c;
    structName_04.field_2._M_allocated_capacity._0_4_ = local_448;
    structName_04.field_2._M_allocated_capacity._4_4_ = local_444;
    structName_04.field_2._8_4_ = rpidx;
    structName_04.field_2._12_4_ = lpidx;
    TType::getCompleteString
              (&errmsg,(TType *)CONCAT44(extraout_var_x00137,iVar6),true,SUB41(uVar24,0),bVar4,true,
               name_04,structName_04);
  }
  else {
LAB_0036d829:
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar12 = StageName(language);
    TInfoSinkBase::append(&infoSink->info,pcVar12);
    if (cVar25 == '\0') {
      TInfoSinkBase::append(&infoSink->info," stage: ");
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar18);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00144,iVar6));
      TInfoSinkBase::append(&infoSink->info," \"");
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      local_288 = GetThreadPoolAllocator();
      local_280 = local_270;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_288,"","");
      uVar22 = (undefined4)((ulong)pTVar28 >> 0x20);
      local_2b0 = GetThreadPoolAllocator();
      local_2a8 = local_298;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_2b0,"","");
      uVar21 = (uint)local_430._0_1_;
      name_07._M_dataplus._M_p = (pointer)&local_2b0;
      name_07._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_288;
      name_07._M_string_length._0_4_ = in_stack_fffffffffffffb88;
      name_07._M_string_length._4_4_ = EVar27;
      name_07.field_2._M_allocated_capacity = (size_type)this;
      name_07.field_2._M_local_buf[8] = local_430._0_1_;
      name_07.field_2._9_3_ = 0;
      name_07.field_2._12_4_ = uVar22;
      structName_07._M_dataplus._M_p._0_4_ = uStack_458;
      structName_07._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
      structName_07._M_dataplus._M_p._4_4_ = language;
      structName_07._M_string_length._0_4_ = local_450;
      structName_07._M_string_length._4_4_ = uStack_44c;
      structName_07.field_2._M_allocated_capacity._0_4_ = local_448;
      structName_07.field_2._M_allocated_capacity._4_4_ = local_444;
      structName_07.field_2._8_4_ = rpidx;
      structName_07.field_2._12_4_ = lpidx;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00145,iVar6),true,bVar3,local_430._0_1_,
                 false,name_07,structName_07);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar12 = StageName(EVar27);
      TInfoSinkBase::append(&infoSink->info,pcVar12);
      TInfoSinkBase::append(&infoSink->info," stage: ");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                        (unitSymbol);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00146,iVar6));
      TInfoSinkBase::append(&infoSink->info," \"");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitSymbol);
      pTVar14 = (TType *)CONCAT44(extraout_var_x00147,iVar6);
      local_2d8 = GetThreadPoolAllocator();
      local_2d0 = local_2c0;
      pbVar17 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_2d8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar17,"");
      local_300 = GetThreadPoolAllocator();
      local_2f8 = local_2e8;
      pbVar19 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_300;
LAB_0036dbbf:
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar19,"","");
      name_08._M_dataplus._M_p = (pointer)pbVar19;
      name_08._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)pbVar17;
      name_08._M_string_length._0_4_ = in_stack_fffffffffffffb88;
      name_08._M_string_length._4_4_ = EVar27;
      name_08.field_2._M_allocated_capacity = (size_type)this;
      name_08.field_2._8_4_ = uVar21;
      name_08.field_2._12_4_ = uVar22;
      structName_08._M_dataplus._M_p._0_4_ = uStack_458;
      structName_08._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
      structName_08._M_dataplus._M_p._4_4_ = language;
      structName_08._M_string_length._0_4_ = local_450;
      structName_08._M_string_length._4_4_ = uStack_44c;
      structName_08.field_2._M_allocated_capacity._0_4_ = local_448;
      structName_08.field_2._M_allocated_capacity._4_4_ = local_444;
      structName_08.field_2._8_4_ = rpidx;
      structName_08.field_2._12_4_ = lpidx;
      TType::getCompleteString
                (&errmsg,pTVar14,true,bVar3,SUB41(uVar21,0),false,name_08,structName_08);
    }
    else {
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      iVar16 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      local_1e8 = GetThreadPoolAllocator();
      uVar22 = (undefined4)((ulong)pTVar28 >> 0x20);
      lVar20 = *(long *)(CONCAT44(extraout_var_x00141,iVar16) + 8);
      local_1e0 = local_1d0;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_1e8,lVar20,
                          *(long *)(CONCAT44(extraout_var_x00141,iVar16) + 0x10) + lVar20);
      local_210 = GetThreadPoolAllocator();
      local_208 = local_1f8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_210,"");
      bVar4 = local_430._0_1_;
      name_05._M_dataplus._M_p = (pointer)&local_210;
      name_05._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_1e8;
      name_05._M_string_length._0_4_ = in_stack_fffffffffffffb88;
      name_05._M_string_length._4_4_ = EVar27;
      name_05.field_2._M_allocated_capacity = (size_type)this;
      name_05.field_2._8_4_ = uVar24;
      name_05.field_2._12_4_ = uVar22;
      structName_05._M_dataplus._M_p._0_4_ = uStack_458;
      structName_05._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
      structName_05._M_dataplus._M_p._4_4_ = language;
      structName_05._M_string_length._0_4_ = local_450;
      structName_05._M_string_length._4_4_ = uStack_44c;
      structName_05.field_2._M_allocated_capacity._0_4_ = local_448;
      structName_05.field_2._M_allocated_capacity._4_4_ = local_444;
      structName_05.field_2._8_4_ = rpidx;
      structName_05.field_2._12_4_ = lpidx;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00140,iVar6),true,bVar3,local_430._0_1_,
                 true,name_05,structName_05);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar12 = StageName(EVar27);
      TInfoSinkBase::append(&infoSink->info,pcVar12);
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitSymbol);
      iVar16 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                         (unitSymbol);
      local_238 = GetThreadPoolAllocator();
      lVar20 = *(long *)(CONCAT44(extraout_var_x00143,iVar16) + 8);
      local_230 = local_220;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_238,lVar20,
                          *(long *)(CONCAT44(extraout_var_x00143,iVar16) + 0x10) + lVar20);
      local_260 = GetThreadPoolAllocator();
      local_258 = local_248;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_260,"");
      name_06._M_dataplus._M_p = (pointer)&local_260;
      name_06._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_238;
      name_06._M_string_length._0_4_ = in_stack_fffffffffffffb88;
      name_06._M_string_length._4_4_ = EVar27;
      name_06.field_2._M_allocated_capacity = (size_type)this;
      name_06.field_2._8_4_ = uVar24;
      name_06.field_2._12_4_ = uVar22;
      structName_06._M_dataplus._M_p._0_4_ = uStack_458;
      structName_06._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)unitSymbol;
      structName_06._M_dataplus._M_p._4_4_ = language;
      structName_06._M_string_length._0_4_ = local_450;
      structName_06._M_string_length._4_4_ = uStack_44c;
      structName_06.field_2._M_allocated_capacity._0_4_ = local_448;
      structName_06.field_2._M_allocated_capacity._4_4_ = local_444;
      structName_06.field_2._8_4_ = rpidx;
      structName_06.field_2._12_4_ = lpidx;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00142,iVar6),true,SUB41(uVar24,0),bVar4,
                 true,name_06,structName_06);
    }
  }
  TInfoSinkBase::append(&infoSink->info,&errmsg);
  pcVar12 = "\"\n";
LAB_0036dc08:
  TInfoSinkBase::append(&infoSink->info,pcVar12);
  return;
}

Assistant:

void TIntermediate::mergeErrorCheck(TInfoSink& infoSink, const TIntermSymbol& symbol, const TIntermSymbol& unitSymbol)
{
    EShLanguage stage = symbol.getStage();
    EShLanguage unitStage = unitSymbol.getStage();
    bool crossStage = stage != unitStage;
    bool writeTypeComparison = false;
    bool errorReported = false;
    bool printQualifiers = false;
    bool printPrecision = false;
    bool printType = false;

    // Types have to match
    {
        // but, we make an exception if one is an implicit array and the other is sized
        // or if the array sizes differ because of the extra array dimension on some in/out boundaries
        bool arraysMatch = false;
        if (isIoResizeArray(symbol.getType(), stage) || isIoResizeArray(unitSymbol.getType(), unitStage)) {
            // if the arrays have an extra dimension because of the stage.
            // compare dimensions while ignoring the outer dimension
            unsigned int firstDim = isIoResizeArray(symbol.getType(), stage) ? 1 : 0;
            unsigned int numDim = symbol.getArraySizes()
                ? symbol.getArraySizes()->getNumDims() : 0;
            unsigned int unitFirstDim = isIoResizeArray(unitSymbol.getType(), unitStage) ? 1 : 0;
            unsigned int unitNumDim = unitSymbol.getArraySizes()
                ? unitSymbol.getArraySizes()->getNumDims() : 0;
            arraysMatch = (numDim - firstDim) == (unitNumDim - unitFirstDim);
            // check that array sizes match as well
            for (unsigned int i = 0; i < (numDim - firstDim) && arraysMatch; i++) {
                if (symbol.getArraySizes()->getDimSize(firstDim + i) !=
                    unitSymbol.getArraySizes()->getDimSize(unitFirstDim + i)) {
                    arraysMatch = false;
                    break;
                }
            }
        }
        else {
            arraysMatch = symbol.getType().sameArrayness(unitSymbol.getType()) ||
                (symbol.getType().isArray() && unitSymbol.getType().isArray() &&
                 (symbol.getType().isImplicitlySizedArray() || unitSymbol.getType().isImplicitlySizedArray() ||
                  symbol.getType().isUnsizedArray() || unitSymbol.getType().isUnsizedArray()));
        }

        int lpidx = -1;
        int rpidx = -1;
        if (!symbol.getType().sameElementType(unitSymbol.getType(), &lpidx, &rpidx)) {
            if (lpidx >= 0 && rpidx >= 0) {
                error(infoSink, "Member names and types must match:", unitStage);
                infoSink.info << "    Block: " << symbol.getType().getTypeName() << "\n";
                infoSink.info << "        " << StageName(stage) << " stage: \""
                              << (*symbol.getType().getStruct())[lpidx].type->getCompleteString(true, false, false, true,
                                      (*symbol.getType().getStruct())[lpidx].type->getFieldName()) << "\"\n";
                infoSink.info << "        " << StageName(unitStage) << " stage: \""
                              << (*unitSymbol.getType().getStruct())[rpidx].type->getCompleteString(true, false, false, true,
                                      (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName()) << "\"\n";
                errorReported = true;
            } else if (lpidx >= 0 && rpidx == -1) {
                  TString errmsg = StageName(stage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(unitStage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                    << (*symbol.getType().getStruct())[lpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else if (lpidx == -1 && rpidx >= 0) {
                  TString errmsg = StageName(unitStage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(stage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                    << (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else {
                  error(infoSink, "Types must match:", unitStage);
                  writeTypeComparison = true;
                  printType = true;
            }
        } else if (!arraysMatch) {
            error(infoSink, "Array sizes must be compatible:", unitStage);
            writeTypeComparison = true;
            printType = true;
        } else if (!symbol.getType().sameTypeParameters(unitSymbol.getType())) {
            error(infoSink, "Type parameters must match:", unitStage);
            writeTypeComparison = true;
            printType = true;
        }
    }

    // Interface block  member-wise layout qualifiers have to match
    if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
        symbol.getType().getStruct() && unitSymbol.getType().getStruct() &&
        symbol.getType().sameStructType(unitSymbol.getType())) {
        unsigned int li = 0;
        unsigned int ri = 0;
        while (li < symbol.getType().getStruct()->size() && ri < unitSymbol.getType().getStruct()->size()) {
            if ((*symbol.getType().getStruct())[li].type->hiddenMember()) {
                ++li;
                continue;
            }
            if ((*unitSymbol.getType().getStruct())[ri].type->hiddenMember()) {
                ++ri;
                continue;
            }
            const TQualifier& qualifier = (*symbol.getType().getStruct())[li].type->getQualifier();
            const TQualifier & unitQualifier = (*unitSymbol.getType().getStruct())[ri].type->getQualifier();
            bool layoutQualifierError = false;
            if (qualifier.layoutMatrix != unitQualifier.layoutMatrix) {
                error(infoSink, "Interface block member layout matrix qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutOffset != unitQualifier.layoutOffset) {
                error(infoSink, "Interface block member layout offset qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutAlign != unitQualifier.layoutAlign) {
                error(infoSink, "Interface block member layout align qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutLocation != unitQualifier.layoutLocation) {
                error(infoSink, "Interface block member layout location qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutComponent != unitQualifier.layoutComponent) {
                error(infoSink, "Interface block member layout component qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (layoutQualifierError) {
                infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                              << (*symbol.getType().getStruct())[li].type->getFieldName() << " \""
                              << (*symbol.getType().getStruct())[li].type->getCompleteString(true, true, false, false) << "\"\n";
                infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                              << (*unitSymbol.getType().getStruct())[ri].type->getFieldName() << " \""
                              << (*unitSymbol.getType().getStruct())[ri].type->getCompleteString(true, true, false, false) << "\"\n";
                errorReported = true;
            }
            ++li;
            ++ri;
        }
    }

    bool isInOut = crossStage &&
                   ((symbol.getQualifier().storage == EvqVaryingIn && unitSymbol.getQualifier().storage == EvqVaryingOut) ||
                   (symbol.getQualifier().storage == EvqVaryingOut && unitSymbol.getQualifier().storage == EvqVaryingIn));

    // Qualifiers have to (almost) match
    // Storage...
    if (!isInOut && symbol.getQualifier().storage != unitSymbol.getQualifier().storage) {
        error(infoSink, "Storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Uniform and buffer blocks must either both have an instance name, or
    // must both be anonymous. The names don't need to match though.
    if (symbol.getQualifier().isUniformOrBuffer() &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()))) {
        error(infoSink, "Matched Uniform or Storage blocks must all be anonymous,"
                        " or all be named:", unitStage);
        writeTypeComparison = true;
    }

    if (symbol.getQualifier().storage == unitSymbol.getQualifier().storage &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()) ||
         (!IsAnonymous(symbol.getName()) && symbol.getName() != unitSymbol.getName()))) {
        warn(infoSink, "Matched shader interfaces are using different instance names.", unitStage);
        writeTypeComparison = true;
    }

    // Precision...
    if (!isInOut && symbol.getQualifier().precision != unitSymbol.getQualifier().precision) {
        error(infoSink, "Precision qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Invariance...
    if (! crossStage && symbol.getQualifier().invariant != unitSymbol.getQualifier().invariant) {
        error(infoSink, "Presence of invariant qualifier must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Precise...
    if (! crossStage && symbol.getQualifier().isNoContraction() != unitSymbol.getQualifier().isNoContraction()) {
        error(infoSink, "Presence of precise qualifier must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Auxiliary and interpolation...
    // "interpolation qualification (e.g., flat) and auxiliary qualification (e.g. centroid) may differ.
    //  These mismatches are allowed between any pair of stages ...
    //  those provided in the fragment shader supersede those provided in previous stages."
    if (!crossStage &&
        (symbol.getQualifier().centroid  != unitSymbol.getQualifier().centroid ||
        symbol.getQualifier().smooth    != unitSymbol.getQualifier().smooth ||
        symbol.getQualifier().flat      != unitSymbol.getQualifier().flat ||
        symbol.getQualifier().isSample()!= unitSymbol.getQualifier().isSample() ||
        symbol.getQualifier().isPatch() != unitSymbol.getQualifier().isPatch() ||
        symbol.getQualifier().isNonPerspective() != unitSymbol.getQualifier().isNonPerspective())) {
        error(infoSink, "Interpolation and auxiliary storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Memory...
    bool memoryQualifierError = false;
    if (symbol.getQualifier().coherent != unitSymbol.getQualifier().coherent) {
        error(infoSink, "Memory coherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().devicecoherent != unitSymbol.getQualifier().devicecoherent) {
        error(infoSink, "Memory devicecoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().queuefamilycoherent != unitSymbol.getQualifier().queuefamilycoherent) {
        error(infoSink, "Memory queuefamilycoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().workgroupcoherent != unitSymbol.getQualifier().workgroupcoherent) {
        error(infoSink, "Memory workgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().subgroupcoherent != unitSymbol.getQualifier().subgroupcoherent) {
        error(infoSink, "Memory subgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().shadercallcoherent != unitSymbol.getQualifier().shadercallcoherent) {
        error(infoSink, "Memory shadercallcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nonprivate != unitSymbol.getQualifier().nonprivate) {
        error(infoSink, "Memory nonprivate qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().volatil != unitSymbol.getQualifier().volatil) {
        error(infoSink, "Memory volatil qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nontemporal != unitSymbol.getQualifier().nontemporal) {
        error(infoSink, "Memory nontemporal qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().restrict != unitSymbol.getQualifier().restrict) {
        error(infoSink, "Memory restrict qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().readonly != unitSymbol.getQualifier().readonly) {
        error(infoSink, "Memory readonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().writeonly != unitSymbol.getQualifier().writeonly) {
        error(infoSink, "Memory writeonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (memoryQualifierError) {
          writeTypeComparison = true;
          printQualifiers = true;
    }

    // Layouts...
    // TODO: 4.4 enhanced layouts: Generalize to include offset/align: current spec
    //       requires separate user-supplied offset from actual computed offset, but
    //       current implementation only has one offset.
    bool layoutQualifierError = false;
    if (symbol.getQualifier().layoutMatrix != unitSymbol.getQualifier().layoutMatrix) {
        error(infoSink, "Layout matrix qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutPacking != unitSymbol.getQualifier().layoutPacking) {
        error(infoSink, "Layout packing qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasLocation() && unitSymbol.getQualifier().hasLocation() && symbol.getQualifier().layoutLocation != unitSymbol.getQualifier().layoutLocation) {
        error(infoSink, "Layout location qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutComponent != unitSymbol.getQualifier().layoutComponent) {
        error(infoSink, "Layout component qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutIndex != unitSymbol.getQualifier().layoutIndex) {
        error(infoSink, "Layout index qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && unitSymbol.getQualifier().hasBinding() && symbol.getQualifier().layoutBinding != unitSymbol.getQualifier().layoutBinding) {
        error(infoSink, "Layout binding qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && (symbol.getQualifier().layoutOffset != unitSymbol.getQualifier().layoutOffset)) {
        error(infoSink, "Layout offset qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (layoutQualifierError) {
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Initializers have to match, if both are present, and if we don't already know the types don't match
    if (! writeTypeComparison && ! errorReported) {
        if (! symbol.getConstArray().empty() && ! unitSymbol.getConstArray().empty()) {
            if (symbol.getConstArray() != unitSymbol.getConstArray()) {
                error(infoSink, "Initializers must match:", unitStage);
                infoSink.info << "    " << symbol.getName() << "\n";
            }
        }
    }

    if (writeTypeComparison) {
        if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
            symbol.getType().getStruct() && unitSymbol.getType().getStruct()) {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, symbol.getName(), symbol.getType().getTypeName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, unitSymbol.getName(), unitSymbol.getType().getTypeName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << " Instance: " << symbol.getName()
              << ": \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << " Instance: " << unitSymbol.getName()
              << ": \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        } else {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, symbol.getName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, unitSymbol.getName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: " << symbol.getName() << " \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: " << unitSymbol.getName() << " \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        }
    }
}